

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall transaction_tests::tx_oversized::test_method(tx_oversized *this)

{
  undefined1 uVar1;
  bool bVar2;
  lazy_ostream *payloadSize;
  long in_FS_OFFSET;
  size_t maxPayloadSize;
  size_t oversizedTransactionBaseSize;
  uint maxTransactionSize;
  anon_class_1_0_00000001 createTransaction;
  TxValidationState state_1;
  TxValidationState state;
  CTransaction *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  size_t in_stack_fffffffffffffb98;
  size_t line_num;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  lazy_ostream *in_stack_fffffffffffffba8;
  size_t in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [2];
  const_string local_350;
  lazy_ostream local_340 [3];
  TxValidationState *in_stack_fffffffffffffcf0;
  CTransaction *in_stack_fffffffffffffcf8;
  const_string local_2e8 [2];
  lazy_ostream local_2c8 [2];
  assertion_result local_2a8 [2];
  ParamsWrapper<TransactionSerParams,_CTransaction> local_270;
  undefined1 local_259;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_259 = 0;
  test_method::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
            );
  local_270 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffffb78,
                         (CTransaction *)
                         CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction>>
            ((ParamsWrapper<TransactionSerParams,_CTransaction> *)
             CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  CTransaction::~CTransaction(in_stack_fffffffffffffb68);
  TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffffb68);
  test_method::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8
            );
  CheckTransaction(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  CTransaction::~CTransaction(in_stack_fffffffffffffb68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,
               (const_string *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<TxValidationResult> *)
               CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    uVar1 = std::operator==(in_stack_fffffffffffffb78,
                            (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    payloadSize = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a8,local_2c8,local_2e8,0x18e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffffb68);
  TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffffb68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,
               (const_string *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT17(uVar1,in_stack_fffffffffffffbd0),
               (size_t)payloadSize);
    CheckTransaction(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    in_stack_fffffffffffffba8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (char (*) [40])in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_340 + 2),local_340,&local_350,0x194,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[40],_const_char_(&)[40]>
                        *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    CTransaction::~CTransaction(in_stack_fffffffffffffb68);
    in_stack_fffffffffffffba7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffba7);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffba8,
               (const_string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               line_num,(const_string *)
                        CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<TxValidationResult> *)
               CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    in_stack_fffffffffffffb97 =
         std::operator==(in_stack_fffffffffffffb78,
                         (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffb78,(bool)in_stack_fffffffffffffb77);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb78,
               (pointer)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               (unsigned_long)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffb68 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffc78,local_3a8,local_3c8,0x195,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffffb68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_oversized)
{
    auto createTransaction =[](size_t payloadSize) {
        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vout.emplace_back(1, CScript() << OP_RETURN << std::vector<unsigned char>(payloadSize));
        return CTransaction(tx);
    };
    const auto maxTransactionSize = MAX_BLOCK_WEIGHT / WITNESS_SCALE_FACTOR;
    const auto oversizedTransactionBaseSize = ::GetSerializeSize(TX_NO_WITNESS(createTransaction(maxTransactionSize))) - maxTransactionSize;

    auto maxPayloadSize = maxTransactionSize - oversizedTransactionBaseSize;
    {
        TxValidationState state;
        CheckTransaction(createTransaction(maxPayloadSize), state);
        BOOST_CHECK(state.GetRejectReason() != "bad-txns-oversize");
    }

    maxPayloadSize += 1;
    {
        TxValidationState state;
        BOOST_CHECK_MESSAGE(!CheckTransaction(createTransaction(maxPayloadSize), state), "Oversized transaction should be invalid");
        BOOST_CHECK(state.GetRejectReason() == "bad-txns-oversize");
    }
}